

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)36>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>_>_>
 __thiscall
wabt::MakeUnique<wabt::RefTypeExpr<(wabt::ExprType)36>,wabt::Type&>(wabt *this,Type *args)

{
  RefTypeExpr<(wabt::ExprType)36> *this_00;
  Location local_40;
  Type local_1c;
  Type *local_18;
  Type *args_local;
  
  local_18 = args;
  args_local = (Type *)this;
  this_00 = (RefTypeExpr<(wabt::ExprType)36> *)operator_new(0x40);
  local_1c.enum_ = local_18->enum_;
  Location::Location(&local_40);
  RefTypeExpr<(wabt::ExprType)36>::RefTypeExpr(this_00,local_1c,&local_40);
  std::
  unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)36>,std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>>>
  ::unique_ptr<std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>>,void>
            ((unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)36>,std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::RefTypeExpr<(wabt::ExprType)36>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>_>,_true,_true>
          )(__uniq_ptr_data<wabt::RefTypeExpr<(wabt::ExprType)36>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}